

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyDfs.c
# Opt level: O3

void Ivy_ManCollectCone_rec(Ivy_Obj_t *pObj,Vec_Ptr_t *vCone)

{
  size_t __size;
  int iVar1;
  uint uVar2;
  void **ppvVar3;
  long lVar4;
  
  if ((*(uint *)&pObj->field_0x8 & 0x10) != 0) {
    return;
  }
  uVar2 = *(uint *)&pObj->field_0x8 & 0xf;
  if (uVar2 == 7) {
    Ivy_ManCollectCone_rec((Ivy_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe),vCone);
    uVar2 = vCone->nSize;
    if (uVar2 != vCone->nCap) {
LAB_007ec12f:
      ppvVar3 = vCone->pArray;
      goto LAB_007ec187;
    }
    if (0xf < (int)uVar2) {
      if (vCone->pArray == (void **)0x0) {
        ppvVar3 = (void **)malloc((ulong)uVar2 << 4);
      }
      else {
        ppvVar3 = (void **)realloc(vCone->pArray,(ulong)uVar2 << 4);
      }
      vCone->pArray = ppvVar3;
      vCone->nCap = uVar2 * 2;
      goto LAB_007ec187;
    }
  }
  else {
    if (uVar2 - 7 < 0xfffffffe) {
      __assert_fail("Ivy_ObjIsNode(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyDfs.c"
                    ,0xb2,"void Ivy_ManCollectCone_rec(Ivy_Obj_t *, Vec_Ptr_t *)");
    }
    Ivy_ManCollectCone_rec((Ivy_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe),vCone);
    Ivy_ManCollectCone_rec((Ivy_Obj_t *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe),vCone);
    iVar1 = vCone->nSize;
    if (0 < (long)iVar1) {
      lVar4 = 0;
      do {
        if ((Ivy_Obj_t *)vCone->pArray[lVar4] == pObj) {
          return;
        }
        lVar4 = lVar4 + 1;
      } while (iVar1 != lVar4);
    }
    if (iVar1 != vCone->nCap) goto LAB_007ec12f;
    if (0xf < iVar1) {
      __size = (ulong)(uint)(iVar1 * 2) * 8;
      if (vCone->pArray == (void **)0x0) {
        ppvVar3 = (void **)malloc(__size);
      }
      else {
        ppvVar3 = (void **)realloc(vCone->pArray,__size);
      }
      vCone->pArray = ppvVar3;
      vCone->nCap = iVar1 * 2;
      goto LAB_007ec187;
    }
  }
  if (vCone->pArray == (void **)0x0) {
    ppvVar3 = (void **)malloc(0x80);
  }
  else {
    ppvVar3 = (void **)realloc(vCone->pArray,0x80);
  }
  vCone->pArray = ppvVar3;
  vCone->nCap = 0x10;
LAB_007ec187:
  iVar1 = vCone->nSize;
  vCone->nSize = iVar1 + 1;
  ppvVar3[iVar1] = pObj;
  return;
}

Assistant:

void Ivy_ManCollectCone_rec( Ivy_Obj_t * pObj, Vec_Ptr_t * vCone )
{
    if ( pObj->fMarkA )
        return;
    if ( Ivy_ObjIsBuf(pObj) )
    {
        Ivy_ManCollectCone_rec( Ivy_ObjFanin0(pObj), vCone );
        Vec_PtrPush( vCone, pObj );
        return;
    }
    assert( Ivy_ObjIsNode(pObj) );
    Ivy_ManCollectCone_rec( Ivy_ObjFanin0(pObj), vCone );
    Ivy_ManCollectCone_rec( Ivy_ObjFanin1(pObj), vCone );
    Vec_PtrPushUnique( vCone, pObj );
}